

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcMinBase.c
# Opt level: O1

void Abc_ObjSortInReverseOrder(Abc_Ntk_t *pNtk,Vec_Ptr_t *vNodes)

{
  Vec_Ptr_t *__ptr;
  long lVar1;
  
  __ptr = Abc_NtkDfsReverse(pNtk);
  if (0 < __ptr->nSize) {
    lVar1 = 0;
    do {
      *(int *)((long)__ptr->pArray[lVar1] + 0x40) = (int)lVar1;
      lVar1 = lVar1 + 1;
    } while (lVar1 < __ptr->nSize);
  }
  if (1 < (long)vNodes->nSize) {
    qsort(vNodes->pArray,(long)vNodes->nSize,8,Abc_ObjCompareByNumber);
  }
  if (0 < __ptr->nSize) {
    lVar1 = 0;
    do {
      *(undefined4 *)((long)__ptr->pArray[lVar1] + 0x40) = 0;
      lVar1 = lVar1 + 1;
    } while (lVar1 < __ptr->nSize);
  }
  if (__ptr->pArray != (void **)0x0) {
    free(__ptr->pArray);
    __ptr->pArray = (void **)0x0;
  }
  if (__ptr != (Vec_Ptr_t *)0x0) {
    free(__ptr);
    return;
  }
  return;
}

Assistant:

void Abc_ObjSortInReverseOrder( Abc_Ntk_t * pNtk, Vec_Ptr_t * vNodes )
{
    Vec_Ptr_t * vOrder;
    Abc_Obj_t * pNode; 
    int i;
    vOrder = Abc_NtkDfsReverse( pNtk );
    Vec_PtrForEachEntry( Abc_Obj_t *, vOrder, pNode, i )
        pNode->iTemp = i;
    Vec_PtrSort( vNodes, (int (*)())Abc_ObjCompareByNumber );
    Vec_PtrForEachEntry( Abc_Obj_t *, vOrder, pNode, i )
        pNode->iTemp = 0;
    Vec_PtrFree( vOrder );
}